

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexInternalShape.h
# Opt level: O3

char * __thiscall
cbtConvexInternalShape::serialize
          (cbtConvexInternalShape *this,void *dataBuffer,cbtSerializer *serializer)

{
  int i;
  long lVar1;
  
  cbtCollisionShape::serialize((cbtCollisionShape *)this,dataBuffer,serializer);
  lVar1 = 0;
  do {
    *(cbtScalar *)((long)dataBuffer + lVar1 * 4 + 0x20) =
         (this->m_implicitShapeDimensions).m_floats[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    *(undefined4 *)((long)dataBuffer + lVar1 * 4 + 0x10) =
         *(undefined4 *)((long)(&this->m_implicitShapeDimensions + -1) + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(cbtScalar *)((long)dataBuffer + 0x30) = this->m_collisionMargin;
  *(undefined4 *)((long)dataBuffer + 0x34) = 0;
  return "cbtConvexInternalShapeData";
}

Assistant:

SIMD_FORCE_INLINE const char* cbtConvexInternalShape::serialize(void* dataBuffer, cbtSerializer* serializer) const
{
	cbtConvexInternalShapeData* shapeData = (cbtConvexInternalShapeData*)dataBuffer;
	cbtCollisionShape::serialize(&shapeData->m_collisionShapeData, serializer);

	m_implicitShapeDimensions.serializeFloat(shapeData->m_implicitShapeDimensions);
	m_localScaling.serializeFloat(shapeData->m_localScaling);
	shapeData->m_collisionMargin = float(m_collisionMargin);

	// Fill padding with zeros to appease msan.
	shapeData->m_padding = 0;

	return "cbtConvexInternalShapeData";
}